

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::setFractionLength
          (DecimalQuantity *this,int32_t minFrac,int32_t maxFrac)

{
  int32_t maxFrac_local;
  int32_t minFrac_local;
  DecimalQuantity *this_local;
  
  this->rReqPos = -minFrac;
  this->rOptPos = -maxFrac;
  return;
}

Assistant:

void DecimalQuantity::setFractionLength(int32_t minFrac, int32_t maxFrac) {
    // Validation should happen outside of DecimalQuantity, e.g., in the Precision class.
    U_ASSERT(minFrac >= 0);
    U_ASSERT(maxFrac >= minFrac);

    // Save values into internal state
    // Negation is safe for minFrac/maxFrac because -Integer.MAX_VALUE > Integer.MIN_VALUE
    rReqPos = -minFrac;
    rOptPos = -maxFrac;
}